

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMake::maybe_add_include_path(CTcMake *this,textchar_t *path)

{
  int iVar1;
  textchar_t *__s1;
  char *in_RSI;
  long in_RDI;
  textchar_t *in_stack_00000008;
  CTcMakePath *inc;
  CTcMakePath *local_18;
  
  local_18 = *(CTcMakePath **)(in_RDI + 0x58);
  while( true ) {
    if (local_18 == (CTcMakePath *)0x0) {
      add_include_path((CTcMake *)inc,in_stack_00000008);
      return;
    }
    __s1 = CTcMakePath::get_path((CTcMakePath *)0x206f83);
    iVar1 = strcmp(__s1,in_RSI);
    if (iVar1 == 0) break;
    local_18 = CTcMakePath::get_next(local_18);
  }
  return;
}

Assistant:

void CTcMake::maybe_add_include_path(const textchar_t *path)
{
    CTcMakePath *inc;

    /* 
     *   scan our existing list of include paths for a match to this path -
     *   if the path is already in our list, we don't want to bother adding
     *   it again 
     */
    for (inc = inc_head_ ; inc != 0 ; inc = inc->get_next())
    {
        /* 
         *   If this existing path matches the new path, we don't need to
         *   bother adding the new path.  Note that we just do a
         *   simple-minded string comparison of the paths, which might not
         *   always detect equivalent paths (this strategy can be fooled by
         *   hard/soft links, differing case in a case-insensitive file
         *   system, and relative vs. absolute notation, among other
         *   things); this isn't too important, though, because the worst
         *   that will happen is that we'll lose a little efficiency by
         *   searching the same directory twice.  
         */
        if (strcmp(inc->get_path(), path) == 0)
            return;
    }

    /* didn't find an exact match for the path, so add it */
    add_include_path(path);
}